

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system.cxx
# Opt level: O2

bool __thiscall xray_re::xr_file_system::parse_fs_spec(xr_file_system *this,xr_reader *r)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  long lVar6;
  char *__first;
  path_alias *ppVar7;
  undefined1 *puVar8;
  char *end;
  uint uVar9;
  char *__first_00;
  char *__last;
  int iVar10;
  char *pcVar11;
  string alias;
  string values [4];
  
  __first_00 = (r->field_2).m_p_s8;
  sVar5 = xr_reader::size(r);
  alias._M_dataplus._M_p = (pointer)&alias.field_2;
  alias._M_string_length = 0;
  alias.field_2._M_local_buf[0] = '\0';
  lVar6 = 0x10;
  do {
    puVar8 = (undefined1 *)((long)&values[0]._M_dataplus._M_p + lVar6);
    *(undefined1 **)((long)values + lVar6 + -0x10) = puVar8;
    *(undefined8 *)((long)values + lVar6 + -8) = 0;
    *puVar8 = 0;
    lVar6 = lVar6 + 0x20;
  } while (lVar6 != 0x90);
  end = __first_00 + sVar5;
  uVar9 = 1;
  do {
    if (end <= __first_00) {
LAB_00151a31:
      lVar6 = 0x60;
      do {
        std::__cxx11::string::~string((string *)((long)&values[0]._M_dataplus._M_p + lVar6));
        lVar6 = lVar6 + -0x20;
      } while (lVar6 != -0x20);
      std::__cxx11::string::~string((string *)&alias);
      return end <= __first_00;
    }
    cVar1 = *__first_00;
    pcVar11 = __first_00;
    if (cVar1 != ';') {
      if (cVar1 == '$') {
        if ((__first_00 + 1 < end) &&
           ((iVar10 = (int)__first_00[1], iVar3 = isalnum(iVar10), iVar10 == 0x5f || (iVar3 != 0))))
        {
          pcVar11 = __first_00 + 2;
          while( true ) {
            if (end <= pcVar11) goto LAB_00151a21;
            cVar1 = *pcVar11;
            if (cVar1 == 0x24) break;
            iVar3 = isalnum((int)cVar1);
            pcVar11 = pcVar11 + 1;
            if ((cVar1 != '_') && (iVar3 == 0)) goto LAB_00151a21;
          }
          std::__cxx11::string::assign<char_const*,void>((string *)&alias,__first_00,pcVar11 + 1);
          pcVar11 = skip_ws(pcVar11 + 1,end);
          if ((pcVar11 != end) && (*pcVar11 == '=')) {
            pcVar11 = pcVar11 + 1;
            uVar2 = 0xfffffffe;
            do {
              uVar4 = uVar2;
              __first = skip_ws(pcVar11,end);
              pcVar11 = (char *)0x0;
              for (__last = __first; __last < end; __last = __last + 1) {
                cVar1 = *__last;
                if ((cVar1 == '\t') || (cVar1 == ' ')) {
                  if (pcVar11 == (char *)0x0) {
                    pcVar11 = __last;
                  }
                }
                else {
                  if (((cVar1 == '\n') || (cVar1 == '\r')) || (cVar1 == '|')) {
                    if (pcVar11 == (char *)0x0) {
                      pcVar11 = __last;
                    }
                    break;
                  }
                  pcVar11 = (char *)0x0;
                }
              }
              if (pcVar11 != (char *)0x0) {
                __last = pcVar11;
              }
              if ((int)uVar4 < 0) {
                if ((__last == end) || (*__last != '|')) {
                  msg("can\'t parse line %u",(ulong)uVar9);
                  goto LAB_00151a31;
                }
              }
              else {
                std::__cxx11::string::assign<char_const*,void>
                          ((string *)(values + uVar4),__first,__last);
              }
              pcVar11 = __last + 1;
            } while (((pcVar11 != end) && (*__last == '|')) && (uVar2 = uVar4 + 1, (int)uVar4 < 3));
            if ((int)uVar4 < 0) {
              __assert_fail("i > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_file_system.cxx"
                            ,0xa8,"bool xray_re::xr_file_system::parse_fs_spec(xr_reader &)");
            }
            if (uVar4 == 0) {
              values[1]._M_string_length = 0;
              *values[1]._M_dataplus._M_p = '\0';
            }
            ppVar7 = add_path_alias(this,&alias,values,values + 1);
            if (ppVar7 != (path_alias *)0x0) {
              if ((1 < uVar4) &&
                 (std::__cxx11::string::_M_assign((string *)&ppVar7->filter), uVar4 != 2)) {
                std::__cxx11::string::_M_assign((string *)&ppVar7->caption);
              }
              goto LAB_001518aa;
            }
            msg("can\'t parse line %u",(ulong)uVar9);
            goto LAB_00151a31;
          }
        }
LAB_00151a21:
        msg("can\'t parse line %u",(ulong)uVar9);
        goto LAB_00151a31;
      }
      iVar3 = isspace((int)cVar1);
      if (iVar3 == 0) {
        msg("can\'t parse line %u",(ulong)uVar9);
        goto LAB_00151a31;
      }
    }
LAB_001518aa:
    do {
      __first_00 = pcVar11;
      if (end <= pcVar11) break;
      __first_00 = pcVar11 + 1;
      cVar1 = *pcVar11;
      pcVar11 = __first_00;
    } while (cVar1 != '\n');
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

bool xr_file_system::parse_fs_spec(xr_reader& r)
{
	const char* p = r.pointer<const char>();
	const char* end = p + r.size();
	std::string alias, values[4];
	for (unsigned line = 1; p < end; p = next_line(p, end), ++line) {
		int c = *p;
		if (c == '$') {
			const char* last = read_alias(p, end);
			if (last == 0) {
				msg("can't parse line %u", line);
				return false;
			}
			alias.assign(p, last);

			p = skip_ws(last, end);
			if (p == end || *p++ != '=') {
				msg("can't parse line %u", line);
				return false;
			}

			int i;
			for (i = -2; i < 4;) {
				last = read_value(p, end);
				if (i < 0 && (last == end || *last != '|')) {
					msg("can't parse line %u", line);
					return false;
				}
				if (i >= 0)
					values[i].assign(p, last);
				p = last + 1;
				++i;
				if (p == end || *last != '|')
					break;
			}
			assert(i > 0);
			if (i < 2)
				values[1].clear();
			path_alias* pa = add_path_alias(alias, values[0], values[1]);
			if (pa == 0) {
				msg("can't parse line %u", line);
				return false;
			}
			if (i > 2)
				pa->filter = values[2];
			if (i > 3)
				pa->caption = values[3];
		} else if (c != ';' && !std::isspace(c)) {
			msg("can't parse line %u", line);
			return false;
		}
	}
	return true;
}